

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::presentEOF(Tokenizer *this)

{
  token_type_e tVar1;
  Tokenizer *this_local;
  
  switch(this->state) {
  case st_top:
  case st_before_token:
    this->type = tt_eof;
    break;
  default:
    QTC::TC("qpdf","QPDFTokenizer EOF reading token",0);
    this->type = tt_bad;
    std::__cxx11::string::operator=((string *)&this->error_message,"EOF while reading token");
    break;
  case st_name:
  case st_literal:
  case st_sign:
  case st_number:
  case st_real:
  case st_decimal:
  case st_name_hex1:
  case st_name_hex2:
    QTC::TC("qpdf","QPDFTokenizer EOF reading appendable token",0);
    presentCharacter(this,'\f');
    this->in_token = true;
    break;
  case st_in_space:
    tVar1 = tt_eof;
    if ((this->include_ignorable & 1U) != 0) {
      tVar1 = tt_space;
    }
    this->type = tVar1;
    break;
  case st_in_comment:
    tVar1 = tt_bad;
    if ((this->include_ignorable & 1U) != 0) {
      tVar1 = tt_comment;
    }
    this->type = tVar1;
    break;
  case st_token_ready:
  }
  this->state = st_token_ready;
  return;
}

Assistant:

void
Tokenizer::presentEOF()
{
    switch (state) {
    case st_name:
    case st_name_hex1:
    case st_name_hex2:
    case st_number:
    case st_real:
    case st_sign:
    case st_decimal:
    case st_literal:
        QTC::TC("qpdf", "QPDFTokenizer EOF reading appendable token");
        // Push any delimiter to the state machine to finish off the final token.
        presentCharacter('\f');
        in_token = true;
        break;

    case st_top:
    case st_before_token:
        type = tt::tt_eof;
        break;

    case st_in_space:
        type = include_ignorable ? tt::tt_space : tt::tt_eof;
        break;

    case st_in_comment:
        type = include_ignorable ? tt::tt_comment : tt::tt_bad;
        break;

    case st_token_ready:
        break;

    default:
        QTC::TC("qpdf", "QPDFTokenizer EOF reading token");
        type = tt::tt_bad;
        error_message = "EOF while reading token";
    }
    state = st_token_ready;
}